

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Fire_PDU::Fire_PDU(Fire_PDU *this)

{
  MunitionDescriptor *this_00;
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> local_38;
  Fire_PDU *local_10;
  Fire_PDU *this_local;
  
  local_10 = this;
  Warfare_Header::Warfare_Header(&this->super_Warfare_Header);
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Fire_PDU_0032d2f0;
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_Location);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&this->m_pDescriptor);
  DATA_TYPE::Vector::Vector(&this->m_Velocity);
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8PDUType = '\x02';
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength = 0x60;
  this_00 = (MunitionDescriptor *)operator_new(0x20);
  DATA_TYPE::MunitionDescriptor::MunitionDescriptor(this_00);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&local_38,(Descriptor *)this_00);
  SetDescriptor(this,&local_38);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr(&local_38);
  return;
}

Assistant:

Fire_PDU::Fire_PDU()
{
    m_ui8PDUType = Fire_PDU_Type;
    m_ui16PDULength = FIRE_PDU_SIZE;
    SetDescriptor( DescPtr( new MunitionDescriptor() ) );
}